

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

SamplerType glu::TextureTestUtil::getSamplerType(TextureFormat format)

{
  ulong uVar1;
  
  uVar1 = (ulong)format >> 0x20;
  if (format.type < HALF_FLOAT) {
    if ((0x38000000UL >> (uVar1 & 0x3f) & 1) != 0) {
      return SAMPLERTYPE_INT;
    }
    if ((0x240200000U >> (uVar1 & 0x3f) & 1) != 0) {
      return SAMPLERTYPE_UINT;
    }
    if ((0x82000000UL >> (uVar1 & 0x3f) & 1) != 0) {
      return (uint)((format.order - D & 0xfffffffd) != 0) * 2;
    }
  }
  return SAMPLERTYPE_FLOAT;
}

Assistant:

SamplerType getSamplerType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return SAMPLERTYPE_INT;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return SAMPLERTYPE_UINT;

		// Texture formats used in depth/stencil textures.
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT_24_8:
			return (format.order == TextureFormat::D || format.order == TextureFormat::DS) ? SAMPLERTYPE_FLOAT : SAMPLERTYPE_UINT;

		default:
			return SAMPLERTYPE_FLOAT;
	}
}